

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_int<unsigned_long_long,fmt::v6::basic_format_specs<char>>
          (basic_writer<fmt::v6::buffer_range<char>_> *this,unsigned_long_long value,
          basic_format_specs<char> *spec)

{
  long in_RDX;
  int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<char>_> *in_stack_ffffffffffffffb8;
  char spec_00;
  basic_format_specs<char> *in_stack_ffffffffffffffc8;
  unsigned_long_long in_stack_ffffffffffffffd0;
  basic_writer<fmt::v6::buffer_range<char>_> *in_stack_ffffffffffffffd8;
  int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<char>_> *in_stack_ffffffffffffffe0;
  
  spec_00 = *(char *)(in_RDX + 8);
  basic_writer<fmt::v6::buffer_range<char>_>::
  int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<char>_>::int_writer
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  handle_int_type_spec<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<char>>>
            (spec_00,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void write_int(T value, const Spec& spec) {
    handle_int_type_spec(spec.type, int_writer<T, Spec>(*this, value, spec));
  }